

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

BinaryBinsSelectExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BinaryBinsSelectExprSyntax,slang::syntax::BinsSelectExpressionSyntax&,slang::parsing::Token,slang::syntax::BinsSelectExpressionSyntax&>
          (BumpAllocator *this,BinsSelectExpressionSyntax *args,Token *args_1,
          BinsSelectExpressionSyntax *args_2)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  BinaryBinsSelectExprSyntax *pBVar6;
  
  pBVar6 = (BinaryBinsSelectExprSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((BinaryBinsSelectExprSyntax *)this->endPtr < pBVar6 + 1) {
    pBVar6 = (BinaryBinsSelectExprSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pBVar6 + 1);
  }
  TVar2 = args_1->kind;
  uVar3 = args_1->field_0x2;
  NVar4.raw = (args_1->numFlags).raw;
  uVar5 = args_1->rawLen;
  pIVar1 = args_1->info;
  (pBVar6->super_BinsSelectExpressionSyntax).super_SyntaxNode.kind = BinaryBinsSelectExpr;
  (pBVar6->super_BinsSelectExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pBVar6->super_BinsSelectExpressionSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pBVar6->left).ptr = args;
  (pBVar6->op).kind = TVar2;
  (pBVar6->op).field_0x2 = uVar3;
  (pBVar6->op).numFlags = (NumericTokenFlags)NVar4.raw;
  (pBVar6->op).rawLen = uVar5;
  (pBVar6->op).info = pIVar1;
  (pBVar6->right).ptr = args_2;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pBVar6;
  (args_2->super_SyntaxNode).parent = (SyntaxNode *)pBVar6;
  return pBVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }